

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O3

void __thiscall QTextTable::removeRows(QTextTable *this,int pos,int num)

{
  uint *puVar1;
  quint32 *pqVar2;
  quint32 qVar3;
  QTextTablePrivate *this_00;
  QTextDocumentPrivate *this_01;
  pointer piVar4;
  Header *pHVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint p;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint *puVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  char *__filename;
  long lVar17;
  uint p_2;
  long in_FS_OFFSET;
  undefined1 local_98 [16];
  ConstIterator local_88;
  QList<int> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < pos && 0 < num) {
    this_00 = *(QTextTablePrivate **)&(this->super_QTextFrame).super_QTextObject.field_0x8;
    if (this_00->dirty == true) {
      QTextTablePrivate::update(this_00);
    }
    uVar12 = this_00->nRows;
    if (uVar12 - pos != 0 && pos <= (int)uVar12) {
      uVar8 = uVar12 - pos;
      if ((uint)(num + pos) <= uVar12) {
        uVar8 = num;
      }
      this_01 = (this_00->super_QTextFramePrivate).super_QTextObjectPrivate.pieceTable;
      iVar6 = this_01->editBlock;
      this_01->editBlock = iVar6 + 1;
      if (iVar6 == 0) {
        this_01->revision = this_01->revision + 1;
      }
      iVar6 = pos;
      if (pos == 0) {
        if (uVar8 == uVar12) {
          uVar10 = (ulong)*(uint *)&(this_00->super_QTextFramePrivate).super_QTextObjectPrivate.
                                    field_0x84;
          pHVar5 = (this_01->fragments).data.field_0.head;
          lVar16 = uVar10 * 0x20;
          __filename = (char *)(ulong)*(uint *)((long)pHVar5 + lVar16 + 0x10);
          uVar12 = *(uint *)((long)pHVar5 + lVar16);
          while (uVar12 != 0) {
            uVar9 = (ulong)uVar12;
            puVar1 = (uint *)((long)pHVar5 + (ulong)uVar12 * 0x20);
            if (*(int *)((long)pHVar5 + (ulong)uVar12 * 0x20 + 8) == (int)uVar10) {
              __filename = (char *)(ulong)((int)__filename + puVar1[4] + puVar1[5]);
            }
            uVar10 = uVar9;
            uVar12 = *puVar1;
          }
          for (uVar12 = *(uint *)((long)pHVar5 +
                                 (ulong)(this_00->super_QTextFramePrivate).fragment_end * 0x20);
              uVar12 != 0; uVar12 = *(uint *)((long)pHVar5 + (ulong)uVar12 * 0x20)) {
          }
          QTextDocumentPrivate::remove(this_01,__filename);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            QTextDocumentPrivate::endEditBlock(this_01);
            return;
          }
          goto LAB_0052ee5b;
        }
        iVar6 = 0;
      }
      cellAt((QTextTable *)&local_58,(int)this,iVar6);
      iVar6 = QTextTableCell::firstPosition((QTextTableCell *)&local_58);
      cellAt((QTextTable *)&local_78,(int)this,(uVar8 - 1) + pos);
      iVar7 = QTextTableCell::lastPosition((QTextTableCell *)&local_78);
      QTextDocumentPrivate::aboutToRemoveCell(this_01,iVar6,iVar7);
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (int *)0x0;
      local_78.d.size = 0;
      if (0 < (int)uVar8) {
        iVar14 = uVar8 + pos;
        iVar6 = this_00->nCols;
        iVar7 = iVar6;
        do {
          if (0 < iVar7) {
            iVar15 = 0;
            do {
              uVar10 = (ulong)(iVar7 * pos + iVar15);
              piVar4 = (this_00->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(this_00->grid).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2) <=
                  uVar10) {
                removeRows();
                goto LAB_0052ee5b;
              }
              qVar3 = piVar4[uVar10];
              if (local_78.d.size == 0) {
LAB_0052eb6a:
                local_58._0_4_ = qVar3;
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)local_58.data);
                QList<int>::end(&local_78);
                local_88._12_4_ = 0xaaaaaaaa;
                local_88.n = qVar3;
                local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_88.pt = &this_01->fragments;
                QTextFormatCollection::format
                          ((QTextFormatCollection *)&local_58,(int)this_01 + 0xe8);
                QTextFormat::toCharFormat((QTextFormat *)local_98);
                QTextFormat::~QTextFormat((QTextFormat *)&local_58);
                iVar6 = QTextFormat::intProperty((QTextFormat *)local_98,0x4810);
                iVar7 = iVar6 + (uint)(iVar6 == 0);
                if (iVar7 < 2) {
                  lVar16 = (this_00->cells).d.size;
                  if (lVar16 == 0) {
LAB_0052ec70:
                    lVar11 = 0;
                  }
                  else {
                    lVar11 = 0;
                    lVar17 = 0;
                    do {
                      if (lVar16 * 4 - lVar17 == 0) goto LAB_0052ec70;
                      lVar11 = lVar11 + 0x100000000;
                      pqVar2 = (quint32 *)((long)(this_00->cells).d.ptr + lVar17);
                      lVar17 = lVar17 + 4;
                    } while (*pqVar2 != qVar3);
                    lVar11 = lVar11 >> 0x20;
                  }
                  puVar13 = &(this_00->super_QTextFramePrivate).fragment_end;
                  if (lVar11 < lVar16) {
                    puVar13 = (uint *)((this_00->cells).d.ptr + lVar11);
                  }
                  uVar12 = *puVar13;
                  uVar8 = QFragmentMap<QTextFragmentData>::ConstIterator::position(&local_88);
                  pHVar5 = (this_01->fragments).data.field_0.head;
                  for (uVar12 = *(uint *)((long)pHVar5 + (ulong)uVar12 * 0x20); uVar12 != 0;
                      uVar12 = *(uint *)((long)pHVar5 + (ulong)uVar12 * 0x20)) {
                  }
                  QFragmentMap<QTextFragmentData>::ConstIterator::position(&local_88);
                  QTextDocumentPrivate::remove(this_01,(char *)(ulong)uVar8);
                }
                else {
                  if (iVar6 == 2) {
                    QTextFormat::clearProperty((QTextFormat *)local_98,0x4810);
                  }
                  else {
                    ::QVariant::QVariant((QVariant *)&local_58,iVar7 + -1);
                    QTextFormat::setProperty((QTextFormat *)local_98,0x4810,(QVariant *)&local_58);
                    ::QVariant::~QVariant((QVariant *)&local_58);
                  }
                  iVar6 = QFragmentMap<QTextFragmentData>::ConstIterator::position(&local_88);
                  QTextDocumentPrivate::setCharFormat
                            (this_01,iVar6,1,(QTextCharFormat *)local_98,SetFormat);
                }
                QTextFormat::~QTextFormat((QTextFormat *)local_98);
                iVar6 = this_00->nCols;
              }
              else {
                lVar16 = 0;
                do {
                  if (local_78.d.size * 4 - lVar16 == 0) goto LAB_0052eb6a;
                  lVar17 = lVar16 + 4;
                  pqVar2 = (quint32 *)((long)local_78.d.ptr + lVar16);
                  lVar16 = lVar17;
                } while (*pqVar2 != qVar3);
                if (lVar17 == 0) goto LAB_0052eb6a;
              }
              iVar15 = iVar15 + 1;
              iVar7 = iVar6;
            } while (iVar15 < iVar6);
          }
          pos = pos + 1;
        } while (pos < iVar14);
      }
      QTextDocumentPrivate::endEditBlock(this_01);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0052ee5b:
  __stack_chk_fail();
}

Assistant:

void QTextTable::removeRows(int pos, int num)
{
    Q_D(QTextTable);
//     qDebug() << "-------- removeRows" << pos << num;

    if (num <= 0 || pos < 0)
        return;
    if (d->dirty)
        d->update();
    if (pos >= d->nRows)
        return;
    if (pos+num > d->nRows)
        num = d->nRows - pos;

    QTextDocumentPrivate *p = d->pieceTable;
    QTextFormatCollection *collection = p->formatCollection();
    p->beginEditBlock();

    // delete whole table?
    if (pos == 0 && num == d->nRows) {
        const int pos = p->fragmentMap().position(d->fragment_start);
        p->remove(pos, p->fragmentMap().position(d->fragment_end) - pos + 1);
        p->endEditBlock();
        return;
    }

    p->aboutToRemoveCell(cellAt(pos, 0).firstPosition(), cellAt(pos + num - 1, d->nCols - 1).lastPosition());

    QList<int> touchedCells;
    for (int r = pos; r < pos + num; ++r) {
        for (int c = 0; c < d->nCols; ++c) {
            int cell = d->grid[r*d->nCols + c];
            if (touchedCells.contains(cell))
                continue;
            touchedCells << cell;
            QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), cell);
            QTextCharFormat fmt = collection->charFormat(it->format);
            int span = fmt.tableCellRowSpan();
            if (span > 1) {
                fmt.setTableCellRowSpan(span - 1);
                p->setCharFormat(it.position(), 1, fmt);
            } else {
                // remove cell
                int index = d->cells.indexOf(cell) + 1;
                int f_end = index < d->cells.size() ? d->cells.at(index) : d->fragment_end;
                p->remove(it.position(), p->fragmentMap().position(f_end) - it.position());
            }
        }
    }

    p->endEditBlock();
//     qDebug() << "-------- end removeRows" << pos << num;
}